

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radix_partitioned_hashtable.cpp
# Opt level: O0

void __thiscall
duckdb::RadixHTLocalSourceState::RadixHTLocalSourceState
          (RadixHTLocalSourceState *this,ExecutionContext *context,
          RadixPartitionedHashTable *radix_ht)

{
  bool bVar1;
  TupleDataLayout *initial_capacity;
  Allocator *this_00;
  DataChunk *this_01;
  const_iterator allocator_00;
  const_iterator types;
  long in_RDX;
  LocalSourceState *in_RDI;
  LogicalType *aggr_type;
  const_iterator __end1;
  const_iterator __begin1;
  vector<duckdb::LogicalType,_true> *__range1;
  vector<duckdb::LogicalType,_true> scan_chunk_types;
  Allocator *allocator;
  ArenaAllocator *in_stack_ffffffffffffff48;
  ClientContext *in_stack_ffffffffffffff50;
  ClientContext *context_00;
  value_type *__x;
  TupleDataScanState *this_02;
  Allocator *in_stack_ffffffffffffff98;
  ArenaAllocator *in_stack_ffffffffffffffa0;
  
  LocalSourceState::LocalSourceState(in_RDI);
  in_RDI->_vptr_LocalSourceState = (_func_int **)&PTR__RadixHTLocalSourceState_035096d0;
  *(undefined1 *)&in_RDI[1]._vptr_LocalSourceState = 0;
  in_RDI[2]._vptr_LocalSourceState = (_func_int **)0xffffffffffffffff;
  unique_ptr<duckdb::GroupedAggregateHashTable,_std::default_delete<duckdb::GroupedAggregateHashTable>,_true>
  ::unique_ptr((unique_ptr<duckdb::GroupedAggregateHashTable,_std::default_delete<duckdb::GroupedAggregateHashTable>,_true>
                *)0x7a488e);
  *(undefined1 *)&in_RDI[4]._vptr_LocalSourceState = 2;
  initial_capacity = RadixPartitionedHashTable::GetLayout((RadixPartitionedHashTable *)0x7a48ad);
  TupleDataLayout::Copy
            ((TupleDataLayout *)
             scan_chunk_types.
             super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
             super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
             super__Vector_impl_data._M_finish);
  BufferAllocator::Get(in_stack_ffffffffffffff50);
  ArenaAllocator::ArenaAllocator
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,(idx_t)initial_capacity);
  this_02 = (TupleDataScanState *)(in_RDI + 0x21);
  RowOperationsState::RowOperationsState
            ((RowOperationsState *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  __x = (value_type *)(in_RDI + 0x23);
  TupleDataScanState::TupleDataScanState(this_02);
  context_00 = (ClientContext *)(in_RDI + 0x62);
  DataChunk::DataChunk((DataChunk *)context_00);
  this_00 = BufferAllocator::Get(context_00);
  vector<duckdb::LogicalType,_true>::vector
            ((vector<duckdb::LogicalType,_true> *)context_00,
             (vector<duckdb::LogicalType,_true> *)this_00);
  this_01 = (DataChunk *)(*(long *)(in_RDX + 0x20) + 0x78);
  allocator_00 = ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::begin
                           ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
                            this_00);
  types = ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::end
                    ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)this_00);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_duckdb::LogicalType_*,_std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>_>
                        *)context_00,
                       (__normal_iterator<const_duckdb::LogicalType_*,_std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>_>
                        *)this_00);
    if (!bVar1) break;
    in_stack_ffffffffffffff98 =
         (Allocator *)
         __gnu_cxx::
         __normal_iterator<const_duckdb::LogicalType_*,_std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>_>
         ::operator*((__normal_iterator<const_duckdb::LogicalType_*,_std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>_>
                      *)&stack0xffffffffffffffa8);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
              ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)this_02,__x);
    __gnu_cxx::
    __normal_iterator<const_duckdb::LogicalType_*,_std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>_>
    ::operator++((__normal_iterator<const_duckdb::LogicalType_*,_std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>_>
                  *)&stack0xffffffffffffffa8);
  }
  DataChunk::Initialize
            (this_01,(Allocator *)allocator_00._M_current,
             (vector<duckdb::LogicalType,_true> *)types._M_current,(idx_t)in_stack_ffffffffffffff98)
  ;
  vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0x7a4ae6);
  return;
}

Assistant:

RadixHTLocalSourceState::RadixHTLocalSourceState(ExecutionContext &context, const RadixPartitionedHashTable &radix_ht)
    : task(RadixHTSourceTaskType::NO_TASK), task_idx(DConstants::INVALID_INDEX), scan_status(RadixHTScanStatus::DONE),
      layout(radix_ht.GetLayout().Copy()), aggregate_allocator(BufferAllocator::Get(context.client)),
      row_state(aggregate_allocator) {
	auto &allocator = BufferAllocator::Get(context.client);
	auto scan_chunk_types = radix_ht.group_types;
	for (auto &aggr_type : radix_ht.op.aggregate_return_types) {
		scan_chunk_types.push_back(aggr_type);
	}
	scan_chunk.Initialize(allocator, scan_chunk_types);
}